

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O0

void add_map_entry(j_decompress_ptr cinfo,int R,int G,int B)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  int index;
  int ncolors;
  JSAMPROW colormap2;
  JSAMPROW colormap1;
  JSAMPROW colormap0;
  int local_38;
  
  lVar2 = *(long *)in_RDI[0x14];
  lVar3 = *(long *)(in_RDI[0x14] + 8);
  lVar4 = *(long *)(in_RDI[0x14] + 0x10);
  iVar1 = *(int *)((long)in_RDI + 0x9c);
  local_38 = 0;
  while( true ) {
    if (iVar1 <= local_38) {
      if (0xff < iVar1) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x39;
        *(undefined4 *)(*in_RDI + 0x2c) = 0x100;
        (**(code **)*in_RDI)(in_RDI);
      }
      *(char *)(lVar2 + iVar1) = (char)in_ESI;
      *(char *)(lVar3 + iVar1) = (char)in_EDX;
      *(char *)(lVar4 + iVar1) = (char)in_ECX;
      *(int *)((long)in_RDI + 0x9c) = *(int *)((long)in_RDI + 0x9c) + 1;
      return;
    }
    if (((*(byte *)(lVar2 + local_38) == in_ESI) && (*(byte *)(lVar3 + local_38) == in_EDX)) &&
       (*(byte *)(lVar4 + local_38) == in_ECX)) break;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

LOCAL(void)
add_map_entry(j_decompress_ptr cinfo, int R, int G, int B)
{
  JSAMPROW colormap0 = cinfo->colormap[0];
  JSAMPROW colormap1 = cinfo->colormap[1];
  JSAMPROW colormap2 = cinfo->colormap[2];
  int ncolors = cinfo->actual_number_of_colors;
  int index;

  /* Check for duplicate color. */
  for (index = 0; index < ncolors; index++) {
    if (colormap0[index] == R && colormap1[index] == G &&
        colormap2[index] == B)
      return;                   /* color is already in map */
  }

  /* Check for map overflow. */
  if (ncolors >= (MAXJSAMPLE + 1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, (MAXJSAMPLE + 1));

  /* OK, add color to map. */
  colormap0[ncolors] = (JSAMPLE)R;
  colormap1[ncolors] = (JSAMPLE)G;
  colormap2[ncolors] = (JSAMPLE)B;
  cinfo->actual_number_of_colors++;
}